

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_NewScFltArray(InterpreterStackFrame *this,OpLayoutAuxiliary *playout)

{
  uint offset;
  FunctionBody *functionBody;
  AuxArray<double> *doubles_00;
  JavascriptLibrary *this_00;
  JavascriptArray *this_01;
  SparseArraySegmentBase *segment_00;
  SparseArraySegment<double> *segment;
  JavascriptNativeFloatArray *arr;
  AuxArray<double> *doubles;
  OpLayoutAuxiliary *playout_local;
  InterpreterStackFrame *this_local;
  
  offset = (playout->super_OpLayoutAuxNoReg).Offset;
  functionBody = GetFunctionBody(this);
  doubles_00 = ByteCodeReader::ReadAuxArray<double>(offset,functionBody);
  this_00 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
  this_01 = (JavascriptArray *)
            JavascriptLibrary::CreateNativeFloatArrayLiteral(this_00,doubles_00->count);
  segment_00 = Js::JavascriptArray::GetHead(this_01);
  Js::JavascriptOperators::AddFloatsToArraySegment
            ((SparseArraySegment<double> *)segment_00,doubles_00);
  Js::JavascriptArray::CheckForceES5Array(this_01);
  SetReg<unsigned_int>(this,playout->R0,this_01);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScFltArray(const unaligned OpLayoutAuxiliary * playout)
    {
        const Js::AuxArray<double> *doubles = Js::ByteCodeReader::ReadAuxArray<double>(playout->Offset, this->GetFunctionBody());

        JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(doubles->count);

        SparseArraySegment<double> * segment = (SparseArraySegment<double>*)arr->GetHead();

        JavascriptOperators::AddFloatsToArraySegment(segment, doubles);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }